

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result_helper.cpp
# Opt level: O3

bool __thiscall
duckdb::TestResultHelper::CheckQueryResult
          (TestResultHelper *this,Query *query,ExecuteContext *context,
          unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
          *owned_result)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true> *__x
  ;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer *ppbVar2;
  SortStyle SVar3;
  SQLLogicTestRunner *this_00;
  pointer pcVar4;
  size_t sVar5;
  pointer pcVar6;
  _Head_base<0UL,_duckdb::QueryResult_*,_false> _Var7;
  bool bVar8;
  pointer pbVar9;
  pointer pbVar10;
  idx_t expected_column_count_00;
  pointer pvVar11;
  pointer pvVar12;
  char cVar13;
  pointer pbVar14;
  char cVar15;
  bool bVar16;
  bool bVar17;
  int iVar18;
  type result;
  string *psVar19;
  long lVar20;
  long lVar21;
  ulong __val;
  const_reference pvVar22;
  undefined7 extraout_var;
  ulong uVar23;
  ulong uVar24;
  reference pvVar25;
  reference this_01;
  reference this_02;
  undefined8 *puVar26;
  long *plVar27;
  iterator iVar28;
  idx_t iVar29;
  idx_t iVar30;
  idx_t iVar31;
  idx_t iVar32;
  mapped_type *pmVar33;
  iterator iVar34;
  mapped_type *pmVar35;
  SourceLineInfo *pSVar36;
  pointer pbVar37;
  ulong uVar38;
  _Head_base<0UL,_duckdb::QueryResult_*,_false> _Var39;
  SQLLogicTestLogger *this_03;
  string *psVar40;
  __normal_iterator<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>_*,_std::vector<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_std::allocator<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>_>_>_>
  __i;
  size_type __n;
  pointer pvVar41;
  iterator __end3;
  size_type __n_00;
  pointer *ppvVar42;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *val;
  __node_base *p_Var43;
  size_type sVar44;
  pointer pbVar45;
  bool bVar46;
  idx_t local_3b0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3a8;
  idx_t expected_column_count;
  undefined4 local_37c;
  string hash_value;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  splits;
  string digest;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  result_values_string;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  vector<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_true>
  rows;
  bool local_27e;
  IResultCapture *local_278;
  SourceLineInfo local_260;
  char local_250 [16];
  unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
  *local_240;
  ExecuteContext *local_238;
  long local_230;
  undefined1 *local_228 [2];
  undefined1 local_218 [16];
  string local_208;
  undefined1 *local_1e8 [2];
  undefined1 local_1d8 [16];
  string local_1c8;
  string local_1a8;
  string local_188;
  string local_168;
  StringRef local_148;
  StringRef local_138;
  SQLLogicTestLogger logger;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d8;
  string local_c0;
  string local_a0;
  string local_80;
  string local_60;
  StringRef local_40;
  
  local_240 = owned_result;
  result = unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
           ::operator*(owned_result);
  this_00 = (query->super_Command).runner;
  expected_column_count = query->expected_column_count;
  SVar3 = query->sort_style;
  bVar46 = query->query_has_label;
  local_238 = context;
  SQLLogicTestLogger::SQLLogicTestLogger(&logger,context,&query->super_Command);
  cVar15 = duckdb::BaseQueryResult::HasError();
  if (cVar15 != '\0') {
    SQLLogicTestLogger::UnexpectedFailure(&logger,result);
    psVar19 = (string *)duckdb::BaseQueryResult::GetError_abi_cxx11_();
    p_Var43 = &(this->runner->ignore_error_messages)._M_h._M_before_begin;
    do {
      p_Var43 = p_Var43->_M_nxt;
      if (p_Var43 == (__node_base *)0x0) {
        bVar46 = false;
        goto LAB_0045621e;
      }
      cVar15 = duckdb::StringUtil::Contains(psVar19,(string *)(p_Var43 + 1));
    } while (cVar15 == '\0');
    bVar46 = true;
    LOCK();
    (this_00->finished_processing_file)._M_base._M_i = true;
    UNLOCK();
    goto LAB_0045621e;
  }
  lVar20 = duckdb::MaterializedQueryResult::RowCount();
  lVar21 = duckdb::BaseQueryResult::ColumnCount();
  __val = lVar21 * lVar20;
  bVar17 = true;
  if (bVar46 == false) {
    if ((long)this_00->hash_threshold < 1) {
      bVar17 = false;
    }
    else {
      bVar17 = (ulong)(long)this_00->hash_threshold < __val;
    }
  }
  __x = &query->values;
  if ((long)(query->values).
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)(query->values).
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start == 0x20) {
    pvVar22 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              ::operator[](__x,0);
    bVar16 = ResultIsHash((string *)pvVar22);
    local_37c = (undefined4)CONCAT71(extraout_var,bVar16);
    bVar8 = true;
    if (!bVar16) {
      bVar8 = bVar17;
    }
  }
  else {
    local_37c = 0;
    bVar8 = bVar17;
  }
  result_values_string.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  result_values_string.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  result_values_string.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_03 = (SQLLogicTestLogger *)this;
  DuckDBConvertResult(this,result,this_00->original_sqlite_test,&result_values_string);
  if (this_00->output_result_mode == true) {
    SQLLogicTestLogger::OutputResult(this_03,result,&result_values_string);
  }
  pbVar37 = result_values_string.
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (SVar3 == VALUE_SORT) {
    if (result_values_string.
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        result_values_string.
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      uVar23 = (long)result_values_string.
                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)result_values_string.
                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5;
      lVar20 = 0x3f;
      if (uVar23 != 0) {
        for (; uVar23 >> lVar20 == 0; lVar20 = lVar20 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                (result_values_string.
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 result_values_string.
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar20 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (pbVar37);
    }
  }
  else if (SVar3 == ROW_SORT) {
    uVar23 = duckdb::BaseQueryResult::ColumnCount();
    uVar24 = __val / uVar23;
    rows.
    super_vector<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_std::allocator<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>_>_>
    .
    super__Vector_base<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_std::allocator<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    rows.
    super_vector<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_std::allocator<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>_>_>
    .
    super__Vector_base<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_std::allocator<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    rows.
    super_vector<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_std::allocator<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>_>_>
    .
    super__Vector_base<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_std::allocator<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_std::allocator<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>_>_>
    ::reserve(&rows.
               super_vector<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_std::allocator<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>_>_>
              ,uVar24);
    if (uVar23 <= __val) {
      local_230 = uVar23 + (uVar23 == 0);
      sVar44 = 0;
      uVar38 = 0;
      do {
        hash_value._M_dataplus._M_p = (pointer)0x0;
        hash_value._M_string_length = 0;
        hash_value.field_2._M_allocated_capacity = 0;
        Catch::clara::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::reserve((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&hash_value,uVar23);
        lVar20 = local_230;
        __n = sVar44;
        do {
          pvVar25 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                    ::operator[](&result_values_string,__n);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &hash_value,pvVar25);
          __n = __n + 1;
          lVar20 = lVar20 + -1;
        } while (lVar20 != 0);
        std::
        vector<duckdb::vector<std::__cxx11::string,true>,std::allocator<duckdb::vector<std::__cxx11::string,true>>>
        ::emplace_back<duckdb::vector<std::__cxx11::string,true>>
                  ((vector<duckdb::vector<std::__cxx11::string,true>,std::allocator<duckdb::vector<std::__cxx11::string,true>>>
                    *)&rows,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                             *)&hash_value);
        Catch::clara::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&hash_value);
        uVar38 = uVar38 + 1;
        sVar44 = sVar44 + uVar23;
      } while (uVar38 < uVar24);
    }
    pvVar12 = rows.
              super_vector<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_std::allocator<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>_>_>
              .
              super__Vector_base<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_std::allocator<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    pvVar11 = rows.
              super_vector<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_std::allocator<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>_>_>
              .
              super__Vector_base<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_std::allocator<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (rows.
        super_vector<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_std::allocator<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>_>_>
        .
        super__Vector_base<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_std::allocator<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        rows.
        super_vector<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_std::allocator<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>_>_>
        .
        super__Vector_base<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_std::allocator<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      lVar21 = (long)rows.
                     super_vector<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_std::allocator<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>_>_>
                     .
                     super__Vector_base<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_std::allocator<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)rows.
                     super_vector<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_std::allocator<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>_>_>
                     .
                     super__Vector_base<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_std::allocator<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
      uVar38 = (lVar21 >> 3) * -0x5555555555555555;
      lVar20 = 0x3f;
      if (uVar38 != 0) {
        for (; uVar38 >> lVar20 == 0; lVar20 = lVar20 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<duckdb::vector<std::__cxx11::string,true>*,std::vector<duckdb::vector<std::__cxx11::string,true>,std::allocator<duckdb::vector<std::__cxx11::string,true>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::TestResultHelper::CheckQueryResult(duckdb::Query_const&,duckdb::ExecuteContext&,duckdb::unique_ptr<duckdb::MaterializedQueryResult,std::default_delete<duckdb::MaterializedQueryResult>,true>)::__0>>
                (rows.
                 super_vector<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_std::allocator<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>_>_>
                 .
                 super__Vector_base<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_std::allocator<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 rows.
                 super_vector<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_std::allocator<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>_>_>
                 .
                 super__Vector_base<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_std::allocator<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar20 ^ 0x3f) * 2 ^ 0x7e);
      if (lVar21 < 0x181) {
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<duckdb::vector<std::__cxx11::string,true>*,std::vector<duckdb::vector<std::__cxx11::string,true>,std::allocator<duckdb::vector<std::__cxx11::string,true>>>>,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::TestResultHelper::CheckQueryResult(duckdb::Query_const&,duckdb::ExecuteContext&,duckdb::unique_ptr<duckdb::MaterializedQueryResult,std::default_delete<duckdb::MaterializedQueryResult>,true>)::__0>>
                  (pvVar11);
      }
      else {
        pvVar41 = pvVar11 + 0x10;
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<duckdb::vector<std::__cxx11::string,true>*,std::vector<duckdb::vector<std::__cxx11::string,true>,std::allocator<duckdb::vector<std::__cxx11::string,true>>>>,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::TestResultHelper::CheckQueryResult(duckdb::Query_const&,duckdb::ExecuteContext&,duckdb::unique_ptr<duckdb::MaterializedQueryResult,std::default_delete<duckdb::MaterializedQueryResult>,true>)::__0>>
                  (pvVar11);
        for (; pvVar41 != pvVar12; pvVar41 = pvVar41 + 1) {
          std::
          __unguarded_linear_insert<__gnu_cxx::__normal_iterator<duckdb::vector<std::__cxx11::string,true>*,std::vector<duckdb::vector<std::__cxx11::string,true>,std::allocator<duckdb::vector<std::__cxx11::string,true>>>>,__gnu_cxx::__ops::_Val_comp_iter<duckdb::TestResultHelper::CheckQueryResult(duckdb::Query_const&,duckdb::ExecuteContext&,duckdb::unique_ptr<duckdb::MaterializedQueryResult,std::default_delete<duckdb::MaterializedQueryResult>,true>)::__0>>
                    (pvVar41);
        }
      }
    }
    if (uVar23 <= __val) {
      lVar20 = 0;
      __n_00 = 0;
      do {
        sVar44 = 0;
        do {
          this_01 = vector<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_true>
                    ::operator[](&rows,__n_00);
          pvVar25 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                    ::operator[](this_01,sVar44);
          this_02 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                    ::operator[](&result_values_string,lVar20 + sVar44);
          std::__cxx11::string::operator=((string *)this_02,(string *)pvVar25);
          sVar44 = sVar44 + 1;
        } while (uVar23 + (uVar23 == 0) != sVar44);
        __n_00 = __n_00 + 1;
        lVar20 = lVar20 + uVar23;
      } while (__n_00 < uVar24);
    }
    std::
    vector<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_std::allocator<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>_>_>
    ::~vector(&rows.
               super_vector<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_std::allocator<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>_>_>
             );
  }
  local_3a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_3a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((long)(query->values).
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)(query->values).
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start != 0x20) {
LAB_00455448:
    Catch::clara::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(&local_3a8,
                (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)__x);
LAB_0045545a:
    hash_value._M_dataplus._M_p = (pointer)&hash_value.field_2;
    hash_value._M_string_length = 0;
    hash_value.field_2._M_allocated_capacity =
         hash_value.field_2._M_allocated_capacity & 0xffffffffffffff00;
    if ((this_00->output_hash_mode != false) || (bVar8)) {
      duckdb::MD5Context::MD5Context((MD5Context *)&rows);
      if (__val != 0) {
        sVar44 = 0;
        do {
          pvVar25 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                    ::operator[](&result_values_string,sVar44);
          duckdb::MD5Context::MD5Update((uchar *)&rows,(ulong)(pvVar25->_M_dataplus)._M_p);
          duckdb::MD5Context::Add((char *)&rows);
          sVar44 = sVar44 + 1;
        } while (__val != sVar44);
      }
      duckdb::MD5Context::FinishHex_abi_cxx11_();
      cVar15 = '\x01';
      if (9 < __val) {
        uVar23 = __val;
        cVar13 = '\x04';
        do {
          cVar15 = cVar13;
          if (uVar23 < 100) {
            cVar15 = cVar15 + -2;
            goto LAB_0045558a;
          }
          if (uVar23 < 1000) {
            cVar15 = cVar15 + -1;
            goto LAB_0045558a;
          }
          if (uVar23 < 10000) goto LAB_0045558a;
          bVar17 = 99999 < uVar23;
          uVar23 = uVar23 / 10000;
          cVar13 = cVar15 + '\x04';
        } while (bVar17);
        cVar15 = cVar15 + '\x01';
      }
LAB_0045558a:
      local_260.file = local_250;
      std::__cxx11::string::_M_construct((ulong)&local_260,cVar15);
      std::__detail::__to_chars_10_impl<unsigned_long>(local_260.file,(uint)local_260.line,__val);
      puVar26 = (undefined8 *)std::__cxx11::string::append((char *)&local_260);
      pSVar36 = (SourceLineInfo *)(puVar26 + 2);
      if ((SourceLineInfo *)*puVar26 == pSVar36) {
        local_2d8.field_2._M_allocated_capacity = (size_type)pSVar36->file;
        local_2d8.field_2._8_8_ = puVar26[3];
        local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
      }
      else {
        local_2d8.field_2._M_allocated_capacity = (size_type)pSVar36->file;
        local_2d8._M_dataplus._M_p = (pointer)*puVar26;
      }
      local_2d8._M_string_length = puVar26[1];
      *puVar26 = pSVar36;
      puVar26[1] = 0;
      *(undefined1 *)(puVar26 + 2) = 0;
      plVar27 = (long *)std::__cxx11::string::_M_append
                                  ((char *)&local_2d8,(ulong)digest._M_dataplus._M_p);
      ppbVar2 = &splits.
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
      pbVar37 = (pointer)(plVar27 + 2);
      if ((pointer)*plVar27 == pbVar37) {
        splits.
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(pbVar37->_M_dataplus)._M_p;
        splits.
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)ppbVar2;
      }
      else {
        splits.
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(pbVar37->_M_dataplus)._M_p;
        splits.
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)*plVar27;
      }
      splits.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)plVar27[1];
      *plVar27 = (long)pbVar37;
      plVar27[1] = 0;
      *(undefined1 *)(plVar27 + 2) = 0;
      std::__cxx11::string::operator=((string *)&hash_value,(string *)&splits);
      if (splits.
          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)ppbVar2) {
        operator_delete(splits.
                        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
        operator_delete(local_2d8._M_dataplus._M_p);
      }
      if (local_260.file != local_250) {
        operator_delete(local_260.file);
      }
      if (this_00->output_hash_mode == true) {
        SQLLogicTestLogger::OutputHash(&logger,&hash_value);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)digest._M_dataplus._M_p != &digest.field_2) {
          operator_delete(digest._M_dataplus._M_p);
        }
LAB_00455705:
        bVar46 = true;
        goto LAB_004561f8;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)digest._M_dataplus._M_p != &digest.field_2) {
        operator_delete(digest._M_dataplus._M_p);
      }
      if (!bVar8) goto LAB_00455793;
      psVar40 = &query->query_label;
      if (bVar46 == false) {
LAB_00455850:
        bVar46 = false;
LAB_00455852:
        if ((char)local_37c != '\0') goto LAB_00455859;
        if (!bVar46) goto LAB_0045589b;
      }
      else {
        iVar28 = std::
                 _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find(&(this_00->hash_label_map)._M_h,psVar40);
        if (iVar28.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
            ._M_cur == (__node_type *)0x0) {
          pmVar33 = std::__detail::
                    _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)&this_00->hash_label_map,psVar40);
          std::__cxx11::string::_M_assign((string *)pmVar33);
          _Var39._M_head_impl =
               (QueryResult *)
               (local_240->
               super_unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>_>
               )._M_t.
               super___uniq_ptr_impl<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::MaterializedQueryResult_*,_std::default_delete<duckdb::MaterializedQueryResult>_>
               .super__Head_base<0UL,_duckdb::MaterializedQueryResult_*,_false>._M_head_impl;
          (local_240->
          super_unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>_>
          )._M_t.
          super___uniq_ptr_impl<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::MaterializedQueryResult_*,_std::default_delete<duckdb::MaterializedQueryResult>_>
          .super__Head_base<0UL,_duckdb::MaterializedQueryResult_*,_false>._M_head_impl =
               (MaterializedQueryResult *)0x0;
          pmVar35 = std::__detail::
                    _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)&this_00->result_label_map,psVar40);
          _Var7._M_head_impl =
               (pmVar35->
               super_unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>_>).
               _M_t.
               super___uniq_ptr_impl<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::QueryResult_*,_std::default_delete<duckdb::QueryResult>_>
               .super__Head_base<0UL,_duckdb::QueryResult_*,_false>._M_head_impl;
          (pmVar35->super_unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>_>
          )._M_t.
          super___uniq_ptr_impl<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>_>._M_t
          .super__Tuple_impl<0UL,_duckdb::QueryResult_*,_std::default_delete<duckdb::QueryResult>_>.
          super__Head_base<0UL,_duckdb::QueryResult_*,_false>._M_head_impl = _Var39._M_head_impl;
          if (_Var7._M_head_impl != (QueryResult *)0x0) {
            (**(code **)(*(long *)_Var7._M_head_impl + 8))();
          }
          goto LAB_00455850;
        }
        sVar5 = *(size_t *)
                 ((long)iVar28.
                        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                        ._M_cur + 0x30);
        if (sVar5 == hash_value._M_string_length) {
          if (sVar5 == 0) goto LAB_00455850;
          iVar18 = bcmp(*(void **)((long)iVar28.
                                         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                                         ._M_cur + 0x28),hash_value._M_dataplus._M_p,sVar5);
          bVar46 = iVar18 != 0;
          goto LAB_00455852;
        }
        if ((char)local_37c == '\0') goto LAB_0045617a;
LAB_00455859:
        pvVar22 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  ::operator[](__x,0);
        sVar5 = pvVar22->_M_string_length;
        if ((sVar5 == hash_value._M_string_length) &&
           ((sVar5 == 0 ||
            (iVar18 = bcmp((pvVar22->_M_dataplus)._M_p,hash_value._M_dataplus._M_p,sVar5),
            iVar18 == 0)))) {
LAB_0045589b:
          digest._M_dataplus._M_p = "REQUIRE";
          digest._M_string_length = 7;
          splits.
          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_b392ee;
          splits.
          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xf4;
          Catch::StringRef::StringRef(&local_40,"!hash_compare_error");
          Catch::AssertionHandler::AssertionHandler
                    ((AssertionHandler *)&rows,(StringRef *)&digest,(SourceLineInfo *)&splits,
                     local_40,Normal);
          digest._M_dataplus._M_p._0_1_ = 1;
          Catch::AssertionHandler::handleExpr<bool>
                    ((AssertionHandler *)&rows,(ExprLhs<bool> *)&digest);
          Catch::AssertionHandler::complete((AssertionHandler *)&rows);
          if (local_27e == false) {
            (*local_278->_vptr_IResultCapture[0x11])();
          }
          goto LAB_00455705;
        }
      }
LAB_0045617a:
      iVar34 = std::
               _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               ::find(&(this_00->result_label_map)._M_h,psVar40);
      if (iVar34.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>_>,_true>
          ._M_cur == (__node_type *)0x0) {
        _Var39._M_head_impl = (QueryResult *)0x0;
      }
      else {
        pmVar35 = std::__detail::
                  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)&this_00->result_label_map,psVar40);
        _Var39._M_head_impl =
             (pmVar35->
             super_unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>_>)._M_t.
             super___uniq_ptr_impl<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>_>.
             _M_t.
             super__Tuple_impl<0UL,_duckdb::QueryResult_*,_std::default_delete<duckdb::QueryResult>_>
             .super__Head_base<0UL,_duckdb::QueryResult_*,_false>._M_head_impl;
      }
      SQLLogicTestLogger::WrongResultHash(&logger,_Var39._M_head_impl,result);
    }
    else {
LAB_00455793:
      expected_column_count_00 = expected_column_count;
      iVar29 = duckdb::BaseQueryResult::ColumnCount();
      iVar30 = expected_column_count_00;
      if (expected_column_count_00 != iVar29) {
        iVar30 = duckdb::BaseQueryResult::ColumnCount();
        expected_column_count = iVar30;
      }
      if (iVar30 != 0) {
        uVar24 = (long)local_3a8.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_3a8.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 5;
        uVar23 = uVar24 / iVar30;
        pbVar37 = local_3a8.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pbVar14 = local_3a8.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        pbVar9 = local_3a8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if ((iVar30 == 1) ||
           (uVar38 = duckdb::MaterializedQueryResult::RowCount(),
           pbVar45 = local_3a8.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
           pbVar37 = local_3a8.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
           pbVar14 = local_3a8.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,
           pbVar9 = local_3a8.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish, uVar24 != uVar38)) {
          for (; pbVar45 = pbVar14,
              pbVar10 = local_3a8.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish,
              bVar46 = pbVar37 !=
                       local_3a8.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,
              local_3a8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = pbVar9, bVar46; pbVar37 = pbVar37 + 1) {
            lVar20 = std::__cxx11::string::find((char)pbVar37,9);
            if (lVar20 == -1) {
              iVar31 = (long)local_3a8.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_3a8.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 5;
              bVar46 = false;
              if (iVar31 % iVar30 == 0) goto LAB_00455963;
              if (expected_column_count_00 != iVar29) {
                bVar46 = false;
                goto LAB_004561d8;
              }
              SQLLogicTestLogger::NotCleanlyDivisible(&logger,iVar30,iVar31);
              goto LAB_004561f6;
            }
            pbVar14 = local_3a8.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pbVar9 = local_3a8.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            local_3a8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = pbVar10;
          }
        }
        uVar23 = (long)local_3a8.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar45 >> 5;
        bVar46 = true;
LAB_00455963:
        iVar31 = duckdb::MaterializedQueryResult::RowCount();
        if (uVar23 == iVar31) {
          if (bVar46 == false) {
            if (__val != 0) {
              uVar23 = 0;
              local_3b0 = 0;
              iVar31 = 0;
              do {
                if ((ulong)((long)local_3a8.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)local_3a8.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar23) break;
                pvVar25 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                          ::operator[](&result_values_string,iVar30 * iVar31 + local_3b0);
                pcVar4 = (pvVar25->_M_dataplus)._M_p;
                local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_208,pcVar4,pcVar4 + pvVar25->_M_string_length);
                pvVar25 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                          ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                        *)&local_3a8,uVar23);
                psVar40 = &local_188;
                local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
                pcVar4 = (pvVar25->_M_dataplus)._M_p;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)psVar40,pcVar4,pcVar4 + pvVar25->_M_string_length);
                bVar46 = CompareValues(this,&logger,result,&local_208,psVar40,iVar31,local_3b0,
                                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                        *)&local_3a8,iVar30,false,&result_values_string);
                iVar18 = (int)psVar40;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_188._M_dataplus._M_p != &local_188.field_2) {
                  operator_delete(local_188._M_dataplus._M_p);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_208._M_dataplus._M_p != &local_208.field_2) {
                  operator_delete(local_208._M_dataplus._M_p);
                }
                if (!bVar46) goto LAB_004561c9;
                local_228[0] = local_218;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_228,"CheckQueryResult: %s:%d","");
                local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
                pcVar6 = (query->super_Command).file_name._M_dataplus._M_p;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_1a8,pcVar6,
                           pcVar6 + (query->super_Command).file_name._M_string_length);
                StringUtil::Format<std::__cxx11::string,int>
                          (&digest,(StringUtil *)local_228,&local_1a8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (ulong)(uint)(query->super_Command).query_line,iVar18);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
                  operator_delete(local_1a8._M_dataplus._M_p);
                }
                if (local_228[0] != local_218) {
                  operator_delete(local_228[0]);
                }
                splits.
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_206109;
                splits.
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x7;
                local_2d8._M_dataplus._M_p =
                     "/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/test/sqlite/result_helper.cpp"
                ;
                local_2d8._M_string_length = 0xce;
                Catch::StringRef::StringRef(&local_148,"success_log.c_str()");
                Catch::AssertionHandler::AssertionHandler
                          ((AssertionHandler *)&rows,(StringRef *)&splits,
                           (SourceLineInfo *)&local_2d8,local_148,Normal);
                local_2d8._M_dataplus._M_p = digest._M_dataplus._M_p;
                splits.
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start = &local_2d8;
                Catch::AssertionHandler::handleExpr<char_const*const&>
                          ((AssertionHandler *)&rows,(ExprLhs<const_char_*const_&> *)&splits);
                Catch::AssertionHandler::complete((AssertionHandler *)&rows);
                if (local_27e == false) {
                  (*local_278->_vptr_IResultCapture[0x11])(local_278,(AssertionHandler *)&rows);
                }
                iVar30 = expected_column_count;
                iVar32 = local_3b0 + 1;
                bVar46 = iVar32 == expected_column_count;
                local_3b0 = 0;
                if (!bVar46) {
                  local_3b0 = iVar32;
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)digest._M_dataplus._M_p != &digest.field_2) {
                  operator_delete(digest._M_dataplus._M_p);
                }
                iVar31 = iVar31 + bVar46;
                uVar23 = uVar23 + 1;
              } while (__val != uVar23);
            }
          }
          else if (__val != 0) {
            uVar23 = 0;
            do {
              ppvVar42 = &rows.
                          super_vector<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_std::allocator<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>_>_>
                          .
                          super__Vector_base<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_std::allocator<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage;
              if ((ulong)((long)local_3a8.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)local_3a8.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar23) break;
              pvVar25 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                      *)&local_3a8,uVar23);
              rows.
              super_vector<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_std::allocator<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>_>_>
              .
              super__Vector_base<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_std::allocator<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)ppvVar42;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&rows,anon_var_dwarf_d0a6f3 + 7,anon_var_dwarf_d0a6f3 + 8);
              duckdb::StringUtil::Split((string *)&splits,(string *)pvVar25);
              if (rows.
                  super_vector<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_std::allocator<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>_>_>
                  .
                  super__Vector_base<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_std::allocator<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_start != (pointer)ppvVar42) {
                operator_delete(rows.
                                super_vector<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_std::allocator<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>_>_>
                                .
                                super__Vector_base<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_std::allocator<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
              }
              iVar30 = expected_column_count;
              iVar31 = (long)splits.
                             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)splits.
                             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 5;
              if (iVar31 != expected_column_count) {
                if (expected_column_count_00 != iVar29) {
                  SQLLogicTestLogger::ColumnCountMismatch
                            (&logger,result,__x,expected_column_count_00,true);
                  iVar31 = (long)splits.
                                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)splits.
                                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 5;
                }
                SQLLogicTestLogger::SplitMismatch(&logger,uVar23 + 1,iVar30,iVar31);
                Catch::clara::std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&splits);
                goto LAB_004561f6;
              }
              if (splits.
                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish !=
                  splits.
                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start) {
                sVar44 = 0;
                do {
                  iVar30 = expected_column_count;
                  pvVar25 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                            ::operator[](&result_values_string,
                                         uVar23 * expected_column_count + sVar44);
                  local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
                  pcVar4 = (pvVar25->_M_dataplus)._M_p;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_1c8,pcVar4,pcVar4 + pvVar25->_M_string_length);
                  pvVar25 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                            ::operator[](&splits,sVar44);
                  psVar40 = &local_c0;
                  pcVar4 = (pvVar25->_M_dataplus)._M_p;
                  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)psVar40,pcVar4,pcVar4 + pvVar25->_M_string_length);
                  bVar46 = CompareValues(this,&logger,result,&local_1c8,psVar40,uVar23,sVar44,
                                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                          *)&local_3a8,iVar30,true,&result_values_string);
                  iVar18 = (int)psVar40;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
                    operator_delete(local_c0._M_dataplus._M_p);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
                    operator_delete(local_1c8._M_dataplus._M_p);
                  }
                  if (!bVar46) {
                    Catch::clara::std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&splits);
                    goto LAB_004561c9;
                  }
                  local_1e8[0] = local_1d8;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_1e8,"CheckQueryResult: %s:%d","");
                  local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
                  pcVar6 = (query->super_Command).file_name._M_dataplus._M_p;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_168,pcVar6,
                             pcVar6 + (query->super_Command).file_name._M_string_length);
                  StringUtil::Format<std::__cxx11::string,int>
                            (&digest,(StringUtil *)local_1e8,&local_168,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (ulong)(uint)(query->super_Command).query_line,iVar18);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_168._M_dataplus._M_p != &local_168.field_2) {
                    operator_delete(local_168._M_dataplus._M_p);
                  }
                  if (local_1e8[0] != local_1d8) {
                    operator_delete(local_1e8[0]);
                  }
                  local_2d8._M_dataplus._M_p = "REQUIRE";
                  local_2d8._M_string_length = 7;
                  local_260.file =
                       "/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/test/sqlite/result_helper.cpp"
                  ;
                  local_260.line = 0xbe;
                  Catch::StringRef::StringRef(&local_138,"success_log.c_str()");
                  Catch::AssertionHandler::AssertionHandler
                            ((AssertionHandler *)&rows,(StringRef *)&local_2d8,&local_260,local_138,
                             Normal);
                  local_260.file = digest._M_dataplus._M_p;
                  local_2d8._M_dataplus._M_p = (pointer)&local_260;
                  Catch::AssertionHandler::handleExpr<char_const*const&>
                            ((AssertionHandler *)&rows,(ExprLhs<const_char_*const_&> *)&local_2d8);
                  Catch::AssertionHandler::complete((AssertionHandler *)&rows);
                  if (local_27e == false) {
                    (*local_278->_vptr_IResultCapture[0x11])(local_278,(AssertionHandler *)&rows);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)digest._M_dataplus._M_p != &digest.field_2) {
                    operator_delete(digest._M_dataplus._M_p);
                  }
                  sVar44 = sVar44 + 1;
                } while (sVar44 < (ulong)((long)splits.
                                                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                .
                                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                          (long)splits.
                                                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                .
                                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start >> 5));
              }
              Catch::clara::std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&splits);
              uVar23 = uVar23 + 1;
            } while (uVar23 != __val);
          }
          bVar46 = true;
          if (expected_column_count_00 == iVar29) goto LAB_004561f8;
          SQLLogicTestLogger::ColumnCountMismatchCorrectResult
                    (&logger,expected_column_count_00,expected_column_count,result);
        }
        else if (expected_column_count_00 == iVar29) {
          SQLLogicTestLogger::WrongRowCount
                    (&logger,uVar23,result,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                      *)&local_3a8,iVar30,bVar46);
        }
        else {
LAB_004561d8:
          SQLLogicTestLogger::ColumnCountMismatch
                    (&logger,result,__x,expected_column_count_00,bVar46);
        }
      }
    }
LAB_004561f6:
    bVar46 = false;
    goto LAB_004561f8;
  }
  pvVar22 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            ::operator[](__x,0);
  pcVar4 = (pvVar22->_M_dataplus)._M_p;
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_60,pcVar4,pcVar4 + pvVar22->_M_string_length);
  bVar17 = ResultIsFile(&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  if (!bVar17) goto LAB_00455448;
  pvVar22 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            ::operator[](__x,0);
  pcVar4 = (pvVar22->_M_dataplus)._M_p;
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_80,pcVar4,pcVar4 + pvVar22->_M_string_length);
  SQLLogicTestRunner::LoopReplacement((string *)&rows,this_00,&local_80,&local_238->running_loops);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  paVar1 = &hash_value.field_2;
  hash_value._M_string_length = 0;
  hash_value.field_2._M_allocated_capacity =
       hash_value.field_2._M_allocated_capacity & 0xffffffffffffff00;
  hash_value._M_dataplus._M_p = (pointer)paVar1;
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a0,
             rows.
             super_vector<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_std::allocator<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>_>_>
             .
             super__Vector_base<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_std::allocator<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (long)&((rows.
                      super_vector<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_std::allocator<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>_>_>
                      .
                      super__Vector_base<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_std::allocator<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish)->
                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start +
             (long)rows.
                   super_vector<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_std::allocator<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>_>_>
                   .
                   super__Vector_base<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_std::allocator<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_start);
  Catch::clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_d8,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)(result + 0xb0));
  LoadResultFromFile(&splits,this,&local_a0,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                      *)&local_d8,&expected_column_count,&hash_value);
  digest.field_2._M_allocated_capacity =
       (size_type)
       local_3a8.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  digest._M_string_length =
       (size_type)
       local_3a8.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  digest._M_dataplus._M_p =
       (pointer)local_3a8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  local_3a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       splits.
       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_3a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       splits.
       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_3a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       splits.
       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  splits.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  splits.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  splits.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Catch::clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&digest);
  Catch::clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&splits);
  Catch::clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p);
  }
  if (hash_value._M_string_length == 0) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)hash_value._M_dataplus._M_p != paVar1) {
      operator_delete(hash_value._M_dataplus._M_p);
    }
    if (rows.
        super_vector<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_std::allocator<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>_>_>
        .
        super__Vector_base<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_std::allocator<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (pointer)&rows.
                  super_vector<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_std::allocator<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>_>_>
                  .
                  super__Vector_base<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_std::allocator<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      operator_delete(rows.
                      super_vector<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_std::allocator<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>_>_>
                      .
                      super__Vector_base<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_std::allocator<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    goto LAB_0045545a;
  }
  SQLLogicTestLogger::PrintErrorHeader(&logger.file_name,(long)logger.query_line,&hash_value);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)hash_value._M_dataplus._M_p != paVar1) {
    operator_delete(hash_value._M_dataplus._M_p);
  }
  if (rows.
      super_vector<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_std::allocator<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>_>_>
      .
      super__Vector_base<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_std::allocator<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (pointer)&rows.
                super_vector<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_std::allocator<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>_>_>
                .
                super__Vector_base<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_std::allocator<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    operator_delete(rows.
                    super_vector<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_std::allocator<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>_>_>
                    .
                    super__Vector_base<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_std::allocator<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  bVar46 = false;
  goto LAB_00456207;
LAB_004561c9:
  bVar46 = false;
LAB_004561f8:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)hash_value._M_dataplus._M_p != &hash_value.field_2) {
    operator_delete(hash_value._M_dataplus._M_p);
  }
LAB_00456207:
  Catch::clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_3a8);
  Catch::clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&result_values_string);
LAB_0045621e:
  SQLLogicTestLogger::~SQLLogicTestLogger(&logger);
  return bVar46;
}

Assistant:

bool TestResultHelper::CheckQueryResult(const Query &query, ExecuteContext &context,
                                        duckdb::unique_ptr<MaterializedQueryResult> owned_result) {
	auto &result = *owned_result;
	auto &runner = query.runner;
	auto expected_column_count = query.expected_column_count;
	auto &values = query.values;
	auto sort_style = query.sort_style;
	auto query_has_label = query.query_has_label;
	auto &query_label = query.query_label;

	SQLLogicTestLogger logger(context, query);
	if (result.HasError()) {
		logger.UnexpectedFailure(result);
		if (SkipErrorMessage(result.GetError())) {
			runner.finished_processing_file = true;
			return true;
		}
		return false;
	}
	idx_t row_count = result.RowCount();
	idx_t column_count = result.ColumnCount();
	idx_t total_value_count = row_count * column_count;
	bool compare_hash =
	    query_has_label || (runner.hash_threshold > 0 && total_value_count > idx_t(runner.hash_threshold));
	bool result_is_hash = false;
	// check if the current line (the first line of the result) is a hash value
	if (values.size() == 1 && ResultIsHash(values[0])) {
		compare_hash = true;
		result_is_hash = true;
	}

	vector<string> result_values_string;
	DuckDBConvertResult(result, runner.original_sqlite_test, result_values_string);
	if (runner.output_result_mode) {
		logger.OutputResult(result, result_values_string);
	}

	// perform any required query sorts
	if (sort_style == SortStyle::ROW_SORT) {
		// row-oriented sorting
		idx_t ncols = result.ColumnCount();
		idx_t nrows = total_value_count / ncols;
		vector<vector<string>> rows;
		rows.reserve(nrows);
		for (idx_t row_idx = 0; row_idx < nrows; row_idx++) {
			vector<string> row;
			row.reserve(ncols);
			for (idx_t col_idx = 0; col_idx < ncols; col_idx++) {
				row.push_back(std::move(result_values_string[row_idx * ncols + col_idx]));
			}
			rows.push_back(std::move(row));
		}
		// sort the individual rows
		std::sort(rows.begin(), rows.end(), [](const vector<string> &a, const vector<string> &b) {
			for (idx_t col_idx = 0; col_idx < a.size(); col_idx++) {
				if (a[col_idx] != b[col_idx]) {
					return a[col_idx] < b[col_idx];
				}
			}
			return false;
		});

		// now reconstruct the values from the rows
		for (idx_t row_idx = 0; row_idx < nrows; row_idx++) {
			for (idx_t col_idx = 0; col_idx < ncols; col_idx++) {
				result_values_string[row_idx * ncols + col_idx] = std::move(rows[row_idx][col_idx]);
			}
		}
	} else if (sort_style == SortStyle::VALUE_SORT) {
		// sort values independently
		std::sort(result_values_string.begin(), result_values_string.end());
	}

	vector<string> comparison_values;
	if (values.size() == 1 && ResultIsFile(values[0])) {
		auto fname = runner.LoopReplacement(values[0], context.running_loops);
		string csv_error;
		comparison_values = LoadResultFromFile(fname, result.names, expected_column_count, csv_error);
		if (!csv_error.empty()) {
			logger.PrintErrorHeader(csv_error);
			return false;
		}
	} else {
		comparison_values = values;
	}

	// compute the hash of the results if there is a hash label or we are past the hash threshold
	string hash_value;
	if (runner.output_hash_mode || compare_hash) {
		MD5Context context;
		for (idx_t i = 0; i < total_value_count; i++) {
			context.Add(result_values_string[i]);
			context.Add("\n");
		}
		string digest = context.FinishHex();
		hash_value = to_string(total_value_count) + " values hashing to " + digest;
		if (runner.output_hash_mode) {
			logger.OutputHash(hash_value);
			return true;
		}
	}

	if (!compare_hash) {
		// check if the row/column count matches
		idx_t original_expected_columns = expected_column_count;
		bool column_count_mismatch = false;
		if (expected_column_count != result.ColumnCount()) {
			// expected column count is different from the count found in the result
			// we try to keep going with the number of columns in the result
			expected_column_count = result.ColumnCount();
			column_count_mismatch = true;
		}
		if (expected_column_count == 0) {
			return false;
		}
		idx_t expected_rows = comparison_values.size() / expected_column_count;
		// we first check the counts: if the values are equal to the amount of rows we expect the results to be row-wise
		bool row_wise = expected_column_count > 1 && comparison_values.size() == result.RowCount();
		if (!row_wise) {
			// the counts do not match up for it to be row-wise
			// however, this can also be because the query returned an incorrect # of rows
			// we make a guess: if everything contains tabs, we still treat the input as row wise
			bool all_tabs = true;
			for (auto &val : comparison_values) {
				if (val.find('\t') == string::npos) {
					all_tabs = false;
					break;
				}
			}
			row_wise = all_tabs;
		}
		if (row_wise) {
			// values are displayed row-wise, format row wise with a tab
			expected_rows = comparison_values.size();
			row_wise = true;
		} else if (comparison_values.size() % expected_column_count != 0) {
			if (column_count_mismatch) {
				logger.ColumnCountMismatch(result, query.values, original_expected_columns, row_wise);
			} else {
				logger.NotCleanlyDivisible(expected_column_count, comparison_values.size());
			}
			return false;
		}
		if (expected_rows != result.RowCount()) {
			if (column_count_mismatch) {
				logger.ColumnCountMismatch(result, query.values, original_expected_columns, row_wise);
			} else {
				logger.WrongRowCount(expected_rows, result, comparison_values, expected_column_count, row_wise);
			}
			return false;
		}

		if (row_wise) {
			idx_t current_row = 0;
			for (idx_t i = 0; i < total_value_count && i < comparison_values.size(); i++) {
				// split based on tab character
				auto splits = StringUtil::Split(comparison_values[i], "\t");
				if (splits.size() != expected_column_count) {
					if (column_count_mismatch) {
						logger.ColumnCountMismatch(result, query.values, original_expected_columns, row_wise);
					}
					logger.SplitMismatch(i + 1, expected_column_count, splits.size());
					return false;
				}
				for (idx_t c = 0; c < splits.size(); c++) {
					bool success = CompareValues(
					    logger, result, result_values_string[current_row * expected_column_count + c], splits[c],
					    current_row, c, comparison_values, expected_column_count, row_wise, result_values_string);
					if (!success) {
						return false;
					}
					// we do this just to increment the assertion counter
					string success_log =
					    StringUtil::Format("CheckQueryResult: %s:%d", query.file_name, query.query_line);
					REQUIRE(success_log.c_str());
				}
				current_row++;
			}
		} else {
			idx_t current_row = 0, current_column = 0;
			for (idx_t i = 0; i < total_value_count && i < comparison_values.size(); i++) {
				bool success = CompareValues(logger, result,
				                             result_values_string[current_row * expected_column_count + current_column],
				                             comparison_values[i], current_row, current_column, comparison_values,
				                             expected_column_count, row_wise, result_values_string);
				if (!success) {
					return false;
				}
				// we do this just to increment the assertion counter
				string success_log = StringUtil::Format("CheckQueryResult: %s:%d", query.file_name, query.query_line);
				REQUIRE(success_log.c_str());

				current_column++;
				if (current_column == expected_column_count) {
					current_row++;
					current_column = 0;
				}
			}
		}
		if (column_count_mismatch) {
			logger.ColumnCountMismatchCorrectResult(original_expected_columns, expected_column_count, result);
			return false;
		}
	} else {
		bool hash_compare_error = false;
		if (query_has_label) {
			// the query has a label: check if the hash has already been computed
			auto entry = runner.hash_label_map.find(query_label);
			if (entry == runner.hash_label_map.end()) {
				// not computed yet: add it tot he map
				runner.hash_label_map[query_label] = hash_value;
				runner.result_label_map[query_label] = std::move(owned_result);
			} else {
				hash_compare_error = entry->second != hash_value;
			}
		}
		if (result_is_hash) {
			D_ASSERT(values.size() == 1);
			hash_compare_error = values[0] != hash_value;
		}
		if (hash_compare_error) {
			QueryResult *expected_result = nullptr;
			if (runner.result_label_map.find(query_label) != runner.result_label_map.end()) {
				expected_result = runner.result_label_map[query_label].get();
			}
			logger.WrongResultHash(expected_result, result);
			return false;
		}
		REQUIRE(!hash_compare_error);
	}
	return true;
}